

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
matches(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        *this,char *name)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  
  __s1 = (this->currentType).text;
  if (__s1 == "$identifier") {
LAB_001dedb9:
    iVar1 = std::__cxx11::string::compare((char *)&this->currentStringValue);
    bVar2 = iVar1 == 0;
  }
  else {
    if (__s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,"$identifier");
      if (iVar1 == 0) goto LAB_001dedb9;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool matches (const char* name) const                       { return matches (Token::identifier) && currentStringValue == name; }